

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep_test.c
# Opt level: O1

void test_rep_ctx_send_nonblock2(void)

{
  nng_err nVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  nng_msg *pnVar5;
  char *pcVar6;
  int i;
  nng_aio **app;
  nng_err result_;
  long lVar7;
  int i_2;
  nng_ctx anStack_c8 [2];
  nng_ctx rep_ctx [10];
  nng_aio *local_98;
  nng_aio *rep_aio [10];
  nng_msg *msg;
  nng_socket local_38;
  nng_socket local_34;
  nng_socket req;
  nng_socket rep;
  
  nVar1 = nng_req0_open_raw(&local_38);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x29b,"%s: expected success, got %s (%d)","nng_req0_open_raw(&req)",pcVar4
                         ,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_rep0_open(&local_34);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x29c,"%s: expected success, got %s (%d)","nng_rep0_open(&rep)",pcVar4,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_ms(local_38,"send-timeout",1000);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                             ,0x29d,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000)",pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms(local_34,"recv-timeout",1000);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0x29e,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000)",pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_ms(local_34,"send-timeout",1000);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                 ,0x29f,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000)",pcVar4,nVar1);
          if (iVar2 != 0) {
            app = &local_98;
            lVar7 = 0;
            do {
              nVar1 = nng_ctx_open((nng_ctx *)((long)&anStack_c8[0].id + lVar7),local_34);
              pcVar4 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                     ,0x2a1,"%s: expected success, got %s (%d)",
                                     "nng_ctx_open(&rep_ctx[i], rep)",pcVar4,nVar1);
              if (iVar2 == 0) goto LAB_00111cc9;
              nVar1 = nng_aio_alloc(app,(_func_void_void_ptr *)0x0,(void *)0x0);
              pcVar4 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                     ,0x2a2,"%s: expected success, got %s (%d)",
                                     "nng_aio_alloc(&rep_aio[i], NULL, NULL)",pcVar4,nVar1);
              if (iVar2 == 0) goto LAB_00111cc9;
              app = app + 1;
              lVar7 = lVar7 + 4;
            } while (lVar7 != 0x28);
            nVar1 = nuts_marry(local_38,local_34);
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                   ,0x2a4,"%s: expected success, got %s (%d)","nuts_marry(req, rep)"
                                   ,pcVar4,nVar1);
            if (iVar2 != 0) {
              lVar7 = 0;
              do {
                nVar1 = nng_msg_alloc((nng_msg **)(rep_aio + 9),4);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                       ,0x2a8,"%s: expected success, got %s (%d)",
                                       "nng_msg_alloc(&msg, 4)",pcVar4,nVar1);
                if (iVar2 == 0) goto LAB_00111cc9;
                nVar1 = nng_msg_append_u32((nng_msg *)rep_aio[9],(uint)lVar7 | 0x80000000);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                       ,0x2a9,"%s: expected success, got %s (%d)",
                                       "nng_msg_append_u32(msg, (unsigned) i | 0x80000000u)",pcVar4,
                                       nVar1);
                if (iVar2 == 0) goto LAB_00111cc9;
                nng_ctx_recv((nng_ctx)anStack_c8[lVar7].id,rep_aio[lVar7 + -1]);
                nVar1 = nng_sendmsg(local_38,(nng_msg *)rep_aio[9],0);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                       ,0x2ab,"%s: expected success, got %s (%d)",
                                       "nng_sendmsg(req, msg, 0)",pcVar4,nVar1);
                if (iVar2 == 0) goto LAB_00111cc9;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 10);
              lVar7 = 0;
              do {
                nng_aio_wait(rep_aio[lVar7 + -1]);
                nVar1 = nng_aio_result(rep_aio[lVar7 + -1]);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                       ,0x2b0,"%s: expected success, got %s (%d)",
                                       "nng_aio_result(rep_aio[i])",pcVar4,nVar1);
                if (iVar2 == 0) goto LAB_00111cc9;
                pnVar5 = nng_aio_get_msg(rep_aio[lVar7 + -1]);
                nng_aio_set_timeout(rep_aio[lVar7 + -1],0);
                nng_aio_set_msg(rep_aio[lVar7 + -1],pnVar5);
                nng_ctx_send((nng_ctx)anStack_c8[lVar7].id,rep_aio[lVar7 + -1]);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 10);
              lVar7 = 0;
              msg._4_4_ = 0;
              iVar2 = 0;
              do {
                nng_aio_wait(rep_aio[lVar7 + -1]);
                nVar1 = nng_aio_result(rep_aio[lVar7 + -1]);
                if (nVar1 == NNG_OK) {
                  msg._4_4_ = msg._4_4_ + 1;
                }
                else {
                  pcVar4 = nng_strerror(NNG_ETIMEDOUT);
                  acutest_check_((uint)(nVar1 == NNG_ETIMEDOUT),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                 ,0x2be,"%s fails with %s","rv",pcVar4);
                  pcVar4 = nng_strerror(NNG_ETIMEDOUT);
                  pcVar6 = nng_strerror(nVar1);
                  acutest_message_("%s: expected %s (%d), got %s (%d)","rv",pcVar4,5,pcVar6,
                                   (ulong)nVar1);
                  pnVar5 = nng_aio_get_msg(rep_aio[lVar7 + -1]);
                  nng_msg_free(pnVar5);
                  iVar2 = iVar2 + 1;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 != 10);
              iVar3 = acutest_check_((uint)(0 < msg._4_4_),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                     ,0x2c4,"%s","num_good > 0");
              if (iVar3 != 0) {
                iVar2 = acutest_check_((uint)(0 < iVar2),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                       ,0x2c5,"%s","num_fail > 0");
                if (iVar2 != 0) {
                  lVar7 = 0;
                  do {
                    nng_aio_free(rep_aio[lVar7 + -1]);
                    nng_ctx_close((nng_ctx)anStack_c8[lVar7].id);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 10);
                  nVar1 = nng_socket_close(local_34);
                  pcVar4 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                         ,0x2cb,"%s: expected success, got %s (%d)",
                                         "nng_socket_close(rep)",pcVar4,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_socket_close(local_38);
                    pcVar4 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                           ,0x2cc,"%s: expected success, got %s (%d)",
                                           "nng_socket_close(req)",pcVar4,nVar1);
                    if (iVar2 != 0) {
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00111cc9:
  acutest_abort_();
}

Assistant:

static void
test_rep_ctx_send_nonblock2(void)
{
	nng_socket rep;
	nng_socket req;
	nng_ctx    rep_ctx[10];
	nng_aio   *rep_aio[10];
	int        num_good = 0;
	int        num_fail = 0;

	// We are going to send a bunch of requests, receive them,
	// but then see that non-block pressure exerts for some, but
	// that at least one non-blocking send works.
	NUTS_PASS(nng_req0_open_raw(&req));
	NUTS_PASS(nng_rep0_open(&rep));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000));
	for (int i = 0; i < 10; i++) {
		NUTS_PASS(nng_ctx_open(&rep_ctx[i], rep));
		NUTS_PASS(nng_aio_alloc(&rep_aio[i], NULL, NULL));
	}
	NUTS_MARRY(req, rep);

	for (int i = 0; i < 10; i++) {
		nng_msg *msg;
		NUTS_PASS(nng_msg_alloc(&msg, 4));
		NUTS_PASS(nng_msg_append_u32(msg, (unsigned) i | 0x80000000u));
		nng_ctx_recv(rep_ctx[i], rep_aio[i]);
		NUTS_PASS(nng_sendmsg(req, msg, 0));
	}
	for (int i = 0; i < 10; i++) {
		nng_msg *msg;
		nng_aio_wait(rep_aio[i]);
		NUTS_PASS(nng_aio_result(rep_aio[i]));
		msg = nng_aio_get_msg(rep_aio[i]);
		nng_aio_set_timeout(rep_aio[i], 0);
		nng_aio_set_msg(rep_aio[i], msg);
		nng_ctx_send(rep_ctx[i], rep_aio[i]);
	}

	for (int i = 0; i < 10; i++) {
		int rv;
		nng_aio_wait(rep_aio[i]);
		rv = nng_aio_result(rep_aio[i]);
		if (rv == 0) {
			num_good++;
		} else {
			NUTS_FAIL(rv, NNG_ETIMEDOUT);
			nng_msg_free(nng_aio_get_msg(rep_aio[i]));
			num_fail++;
		}
	}

	TEST_ASSERT(num_good > 0);
	TEST_ASSERT(num_fail > 0);

	for (int i = 0; i < 10; i++) {
		nng_aio_free(rep_aio[i]);
		nng_ctx_close(rep_ctx[i]);
	}
	NUTS_CLOSE(rep);
	NUTS_CLOSE(req);
}